

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

void HN::parseStory(ItemData *data,Story *res)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  reference pcVar4;
  string *in_RSI;
  key_type *in_RDI;
  char *ch;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int slash;
  string *in_stack_000001e8;
  size_t *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  key_type *pkVar5;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffce0;
  key_type *in_stack_fffffffffffffce8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  allocator<char> *in_stack_fffffffffffffd00;
  key_type *__a;
  string *in_stack_fffffffffffffd08;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  string *local_228;
  int local_220;
  allocator<char> local_219;
  string local_218 [39];
  undefined1 local_1f1 [33];
  string local_1d0 [32];
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [63];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  string *local_10;
  key_type *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::__cxx11::string::operator=(local_10,(string *)pmVar3);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,0);
  *(int *)(local_10 + 0x20) = iVar2;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,0);
  *(int *)(local_10 + 0x24) = iVar2;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  JSON::parseIntArray(in_stack_fffffffffffffd08);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,0);
  *(int *)(local_10 + 0x40) = iVar2;
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::stoll(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,0);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 0x48) = this;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  __s = &local_189;
  __a = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::__cxx11::string::string(local_168,(string *)pmVar3);
  parseHTML(in_stack_000001e8);
  std::__cxx11::string::operator=(local_10 + 0x50,local_148);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1f1;
  pkVar5 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,pkVar5);
  std::__cxx11::string::string(local_1d0,(string *)pmVar3);
  parseHTML(in_stack_000001e8);
  std::__cxx11::string::operator=(local_10 + 0x70,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string((string *)(local_1f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,pkVar5);
  std::__cxx11::string::operator=(local_10 + 0x90,(string *)pmVar3);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::operator=(local_10 + 0xb0,"");
  local_220 = 0;
  local_228 = local_10 + 0x90;
  local_230._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  pkVar5 = local_8;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pkVar5,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pmVar3);
    if (!bVar1) {
      return;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_230);
    if (*pcVar4 == '/') {
      local_220 = local_220 + 1;
    }
    else {
      if (2 < local_220) {
        return;
      }
      if (1 < local_220) {
        std::__cxx11::string::operator+=(local_10 + 0xb0,*pcVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_230);
  } while( true );
}

Assistant:

void parseStory(const ItemData & data, Story & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.descendants = std::stoi(data.at("descendants"));
        } catch (...) {
            res.descendants = 0;
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.kids = JSON::parseIntArray(data.at("kids"));
        } catch (...) {
            res.kids.clear();
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.text = parseHTML(data.at("text"));
        } catch (...) {
            res.text = "";
        }
        try {
            res.title = parseHTML(data.at("title"));
        } catch (...) {
            res.title = "";
        }
        try {
            res.url = data.at("url");
            res.domain = "";
            int slash = 0;
            for (auto & ch : res.url) {
                if (ch == '/') {
                    ++slash;
                    continue;
                }
                if (slash > 2) break;
                if (slash > 1) res.domain += ch;
            }
        } catch (...) {
            res.url = "";
            res.domain = "";
        }
    }